

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::readIntegerTextureViaFBOAndVerify
               (RenderContext *renderCtx,CallLogWrapper *glLog,deUint32 textureGL,
               TextureType textureType,TextureFormat *textureFormat,IVec3 *textureSize,
               ImageLayerVerifier *verifyLayer)

{
  ScopedLogSection SVar1;
  deUint32 dVar2;
  int iVar3;
  int height;
  deUint32 dVar4;
  CubeFace face;
  deBool dVar5;
  GLenum GVar6;
  TestLog *log_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *this;
  undefined4 extraout_var_02;
  int local_16c;
  ConstPixelBufferAccess local_148;
  PixelBufferAccess local_120;
  uint local_f4;
  undefined1 local_f0 [4];
  int sliceOrFaceNdx;
  TextureLevel resultSlice;
  Framebuffer fbo;
  deUint32 textureTargetGL;
  int numSlicesOrFaces;
  allocator<char> local_69;
  string local_68;
  ScopedLogSection local_48;
  ScopedLogSection section;
  TestLog *log;
  IVec3 *textureSize_local;
  TextureFormat *textureFormat_local;
  TextureType textureType_local;
  deUint32 textureGL_local;
  CallLogWrapper *glLog_local;
  RenderContext *renderCtx_local;
  
  log_00 = glu::CallLogWrapper::getLog(glLog);
  section.m_log = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Verification",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&numSlicesOrFaces,
             "Result verification (bind texture layer-by-layer to FBO, read with glReadPixels())",
             (allocator<char> *)((long)&textureTargetGL + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_48,log_00,&local_68,(string *)&numSlicesOrFaces);
  std::__cxx11::string::~string((string *)&numSlicesOrFaces);
  std::allocator<char>::~allocator((allocator<char> *)((long)&textureTargetGL + 3));
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (textureType == TEXTURETYPE_CUBE) {
    local_16c = 6;
  }
  else {
    local_16c = tcu::Vector<int,_3>::z(textureSize);
  }
  dVar2 = Functional::getGLTextureTarget(textureType);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&resultSlice.m_data.m_cap,renderCtx);
  iVar3 = tcu::Vector<int,_3>::x(textureSize);
  height = tcu::Vector<int,_3>::y(textureSize);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_f0,textureFormat,iVar3,height,1);
  dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&resultSlice.m_data.m_cap);
  glu::CallLogWrapper::glBindFramebuffer(glLog,0x8d40,dVar4);
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  dVar4 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(dVar4,"Bind FBO",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x34b);
  glu::CallLogWrapper::glMemoryBarrier(glLog,0x400);
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  dVar4 = (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x800))();
  glu::checkError(dVar4,"glMemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x34e);
  glu::CallLogWrapper::glActiveTexture(glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(glLog,dVar2,textureGL);
  setTexParameteri(glLog,dVar2);
  local_f4 = 0;
  do {
    if (local_16c <= (int)local_f4) {
      renderCtx_local._7_1_ = true;
LAB_007325e9:
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_f0);
      glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)3> *)&resultSlice.m_data.m_cap);
      tcu::ScopedLogSection::~ScopedLogSection(&local_48);
      return renderCtx_local._7_1_;
    }
    if (textureType == TEXTURETYPE_CUBE) {
      face = glslImageFuncZToCubeFace(local_f4);
      dVar2 = cubeFaceToGLFace(face);
      glu::CallLogWrapper::glFramebufferTexture2D(glLog,0x8d40,0x8ce0,dVar2,textureGL,0);
    }
    else if (textureType == TEXTURETYPE_2D) {
      glu::CallLogWrapper::glFramebufferTexture2D(glLog,0x8d40,0x8ce0,0xde1,textureGL,0);
    }
    else if ((textureType == TEXTURETYPE_3D) || (textureType == TEXTURETYPE_2D_ARRAY)) {
      glu::CallLogWrapper::glFramebufferTextureLayer(glLog,0x8d40,0x8ce0,textureGL,0,local_f4);
    }
    iVar3 = (*renderCtx->_vptr_RenderContext[3])();
    dVar2 = (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x800))();
    glu::checkError(dVar2,"Bind texture to framebuffer color attachment 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x35f);
    do {
      dVar5 = ::deGetFalse();
      if ((dVar5 != 0) ||
         (GVar6 = glu::CallLogWrapper::glCheckFramebufferStatus(glLog,0x8d40), GVar6 != 0x8cd5)) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,(char *)0x0,
                   "glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                   ,0x361);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
    tcu::TextureLevel::getAccess(&local_120,(TextureLevel *)local_f0);
    readPixelsRGBAInteger32(&local_120,0,0,glLog);
    iVar3 = (*renderCtx->_vptr_RenderContext[3])();
    dVar2 = (**(code **)(CONCAT44(extraout_var_02,iVar3) + 0x800))();
    glu::checkError(dVar2,"glReadPixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x364);
    SVar1 = section;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_148,(TextureLevel *)local_f0);
    iVar3 = (**verifyLayer->_vptr_ImageLayerVerifier)
                      (verifyLayer,SVar1.m_log,&local_148,(ulong)local_f4);
    if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
      renderCtx_local._7_1_ = false;
      goto LAB_007325e9;
    }
    local_f4 = local_f4 + 1;
  } while( true );
}

Assistant:

static bool readIntegerTextureViaFBOAndVerify (const RenderContext&			renderCtx,
											   glu::CallLogWrapper&			glLog,
											   deUint32						textureGL,
											   TextureType					textureType,
											   const TextureFormat&			textureFormat,
											   const IVec3&					textureSize,
											   const ImageLayerVerifier&	verifyLayer)
{
	DE_ASSERT(isFormatTypeInteger(textureFormat.type));
	DE_ASSERT(textureType != TEXTURETYPE_BUFFER);

	TestLog& log = glLog.getLog();

	const tcu::ScopedLogSection section(log, "Verification", "Result verification (bind texture layer-by-layer to FBO, read with glReadPixels())");

	const int			numSlicesOrFaces	= textureType == TEXTURETYPE_CUBE ? 6 : textureSize.z();
	const deUint32		textureTargetGL		= getGLTextureTarget(textureType);
	glu::Framebuffer	fbo					(renderCtx);
	tcu::TextureLevel	resultSlice			(textureFormat, textureSize.x(), textureSize.y());

	glLog.glBindFramebuffer(GL_FRAMEBUFFER, *fbo);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "Bind FBO");

	glLog.glMemoryBarrier(GL_FRAMEBUFFER_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glMemoryBarrier");

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, textureGL);
	setTexParameteri(glLog, textureTargetGL);

	for (int sliceOrFaceNdx = 0; sliceOrFaceNdx < numSlicesOrFaces; sliceOrFaceNdx++)
	{
		if (textureType == TEXTURETYPE_CUBE)
			glLog.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx)), textureGL, 0);
		else if (textureType == TEXTURETYPE_2D)
			glLog.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textureGL, 0);
		else if (textureType == TEXTURETYPE_3D || textureType == TEXTURETYPE_2D_ARRAY)
			glLog.glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textureGL, 0, sliceOrFaceNdx);
		else
			DE_ASSERT(false);

		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "Bind texture to framebuffer color attachment 0");

		TCU_CHECK(glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

		readPixelsRGBAInteger32(resultSlice.getAccess(), 0, 0, glLog);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glReadPixels");

		if (!verifyLayer(log, resultSlice, sliceOrFaceNdx))
			return false;
	}

	return true;
}